

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

obj * create_oprop(level *lev,obj *otmp,boolean allow_detrimental)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  int local_250;
  int local_244;
  int j;
  int i;
  int threshold;
  int ccount;
  int candidates [128];
  int local_28;
  int skill;
  int type;
  boolean allow_detrimental_local;
  obj *otmp_local;
  level *lev_local;
  
  _type = otmp;
  if (otmp == (obj *)0x0) {
    local_28 = 0;
    j = 4;
    while (1 < j) {
      i = 0;
      for (local_244 = 1; local_244 < 0x1d; local_244 = local_244 + 1) {
        if (j < 3) {
          local_250 = 2;
        }
        else {
          local_250 = j;
        }
        if ((local_250 <= u.weapon_skills[local_244].max_skill) &&
           (j <= u.weapon_skills[local_244].skill)) {
          (&threshold)[i] = local_244;
          i = i + 1;
        }
        if (0x7f < i) break;
      }
      if (i == 0) {
        j = j + -1;
      }
      else {
        iVar1 = rn2(i);
        uVar3 = (&threshold)[iVar1];
        local_28 = suitable_obj_for_skill(uVar3);
        if (local_28 != 0) break;
        i = 0;
        for (local_244 = 1; local_244 < 0x48; local_244 = local_244 + 1) {
          uVar2 = (uint)objects[local_244].oc_subtyp;
          if ((int)uVar2 < 1) {
            uVar2 = -uVar2;
          }
          if (uVar2 == uVar3) {
            (&threshold)[i] = local_244;
            i = i + 1;
          }
          if (i == 0x80) break;
        }
        if (i != 0) {
          iVar1 = rn2(i);
          local_28 = (&threshold)[iVar1];
          break;
        }
        impossible("found no weapons for skill %d?",(ulong)uVar3);
        j = j + -1;
      }
    }
    if (local_28 == 0) {
      _type = mkobj(lev,'\x02','\0');
    }
    else {
      _type = mksobj(lev,local_28,'\x01','\0');
    }
  }
  if (allow_detrimental == '\0') {
    if ((*(uint *)&_type->field_0x4a & 1) == 0) {
      bless(_type);
    }
    else {
      uncurse(_type);
    }
    if (((_type->oclass == '\x02') || (_type->oclass == '\x03')) ||
       ((_type->oclass == '\x04' && (((byte)objects[_type->otyp].field_0x10 >> 5 & 1) != 0)))) {
      if (_type->spe < '\0') {
        _type->spe = '\0';
      }
      else if (_type->spe == '\0') {
        iVar1 = rn2(2);
        _type->spe = (char)iVar1 + '\x01';
      }
    }
  }
  if (((_type->oartifact == '\0') && (((byte)objects[_type->otyp].field_0x10 >> 6 & 1) == 0)) &&
     ((_type->oclass == '\x02' ||
      ((((_type->oclass == '\x06' && (objects[_type->otyp].oc_subtyp != '\0')) ||
        (_type->oclass == '\x05')) || ((_type->oclass == '\x04' || (_type->oclass == '\x03'))))))))
  {
    while( true ) {
      bVar5 = true;
      if (_type->oprops != 0) {
        iVar1 = rn2(5);
        bVar5 = iVar1 == 0;
      }
      if (!bVar5) break;
      iVar1 = rn2(0x14);
      uVar3 = 1 << ((byte)iVar1 & 0x1f);
      if ((((_type->oprops & (long)(int)uVar3) == 0) && ((uVar3 & 8) == 0)) &&
         (((uVar3 & 0xc8000) == 0 || (allow_detrimental != '\0')))) {
        lVar4 = restrict_oprops(_type,(long)(int)uVar3);
        _type->oprops = (long)(int)lVar4 | _type->oprops;
      }
    }
    if ((((_type->oprops & 0xc8000U) != 0) && (allow_detrimental != '\0')) &&
       (iVar1 = rn2(10), iVar1 != 0)) {
      curse(_type);
    }
  }
  return _type;
}

Assistant:

struct obj *create_oprop(struct level *lev, struct obj *otmp,
			 boolean allow_detrimental)
{
	if (!otmp) {
	    int type = 0;
	    int skill = P_NONE;
	    int candidates[128];
	    int ccount;
	    int threshold = P_EXPERT;
	    int i;

	    /* This probably is only ever done for weapons, y'know?
	     * Find an appropriate type of weapon */
	    while (threshold > P_UNSKILLED) {
		ccount = 0;
		for (i = P_FIRST_WEAPON; i < P_LAST_WEAPON; i++) {
		    if (P_MAX_SKILL(i) >= max(threshold, P_BASIC) &&
			P_SKILL(i) >= threshold)
			candidates[ccount++] = i;
		    if (ccount >= 128) break;
		}
		if (ccount == 0) {
		    threshold--;
		    continue;
		}
		skill = candidates[rn2(ccount)];
		if ((type = suitable_obj_for_skill(skill)))
		    break;

		ccount = 0;
		for (i = ARROW; i <= CROSSBOW; i++) {
		    if (abs(objects[i].oc_skill) == skill)
			candidates[ccount++] = i;
		    if (ccount == 128) break;
		}
		if (!ccount) {
		    impossible("found no weapons for skill %d?", skill);
		    threshold--;
		    continue;
		}
		type = candidates[rn2(ccount)];
		break;
	    }

	    /* Now make one, if we can */
	    if (type != 0)
		otmp = mksobj(lev, type, TRUE, FALSE);
	    else
		otmp = mkobj(lev, WEAPON_CLASS, FALSE);
	}

	/* Regardless if it's special or not, fix it up as necessary */
	if (!allow_detrimental) {
	    if (otmp->cursed) uncurse(otmp);
	    else bless(otmp);

	    if (otmp->oclass == WEAPON_CLASS ||
		otmp->oclass == ARMOR_CLASS ||
		(otmp->oclass == RING_CLASS && objects[otmp->otyp].oc_charged)) {
		if (otmp->spe < 0) otmp->spe = 0;
		else if (otmp->spe == 0) otmp->spe = rn1(2, 1);
	    }
	}

	/* Don't spruce up artifacts */
	if (otmp->oartifact) return otmp;
	else if (objects[otmp->otyp].oc_unique) return otmp;

	if (otmp->oclass != WEAPON_CLASS && !is_weptool(otmp) &&
	    otmp->oclass != AMULET_CLASS &&
	    otmp->oclass != RING_CLASS &&
	    otmp->oclass != ARMOR_CLASS)
	    return otmp;

	while (!otmp->oprops || !rn2(5)) {
	    int j = 1 << rn2(MAX_ITEM_PROPS); /* pick an item property */

	    if (otmp->oprops & j) continue;

	    /* don't randomly put insta-death weapons in monsters' hands */
	    if (j & ITEM_VORPAL) continue;

	    if ((j & (ITEM_FUMBLING|ITEM_HUNGER|ITEM_AGGRAVATE)) &&
		!allow_detrimental)
		continue;

	    j = restrict_oprops(otmp, j);
	    otmp->oprops |= j;
	}

	if ((otmp->oprops & (ITEM_FUMBLING|ITEM_HUNGER|ITEM_AGGRAVATE)) &&
	    allow_detrimental && rn2(10)) {
	    curse(otmp);
	}

	return otmp;
}